

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_libapi.cpp
# Opt level: O0

ze_result_t
zetModuleGetDebugInfo
          (zet_module_handle_t hModule,zet_module_debug_info_format_t format,size_t *pSize,
          uint8_t *pDebugInfo)

{
  zet_pfnModuleGetDebugInfo_t p_Var1;
  __pointer_type p_Var2;
  zet_pfnModuleGetDebugInfo_t pfnGetDebugInfo;
  uint8_t *pDebugInfo_local;
  size_t *pSize_local;
  zet_module_debug_info_format_t format_local;
  zet_module_handle_t hModule_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zet_dditable_t_*>::load
                       ((atomic<_zet_dditable_t_*> *)(ze_lib::context + 0x18),memory_order_seq_cst);
    p_Var1 = (p_Var2->Module).pfnGetDebugInfo;
    if (p_Var1 == (zet_pfnModuleGetDebugInfo_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hModule_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hModule_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hModule_local._4_4_ = (*p_Var1)(hModule,format,pSize,pDebugInfo);
    }
  }
  else {
    hModule_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hModule_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zetModuleGetDebugInfo(
    zet_module_handle_t hModule,                    ///< [in] handle of the module
    zet_module_debug_info_format_t format,          ///< [in] debug info format requested
    size_t* pSize,                                  ///< [in,out] size of debug info in bytes
    uint8_t* pDebugInfo                             ///< [in,out][optional] byte pointer to debug info
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zet_pfnModuleGetDebugInfo_t pfnGetDebugInfo = [&result] {
        auto pfnGetDebugInfo = ze_lib::context->zetDdiTable.load()->Module.pfnGetDebugInfo;
        if( nullptr == pfnGetDebugInfo ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetDebugInfo;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetDebugInfo( hModule, format, pSize, pDebugInfo );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetDebugInfo = ze_lib::context->zetDdiTable.load()->Module.pfnGetDebugInfo;
    if( nullptr == pfnGetDebugInfo ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetDebugInfo( hModule, format, pSize, pDebugInfo );
    #endif
}